

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omnidir_model.hpp
# Opt level: O0

double __thiscall
OmnidirModel::computeReprojectionErrors
          (OmnidirModel *this,
          vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
          *object_points_list,
          vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
          *image_points_list,vector<cv::Mat,_std::allocator<cv::Mat>_> *rvecs,
          vector<cv::Mat,_std::allocator<cv::Mat>_> *tvecs,Mat *idx,Mat *camera_matrix,Mat *xi,
          Mat *distort_coeffs,vector<double,_std::allocator<double>_> *image_reproj_errors)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  int *piVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  double *pdVar7;
  _OutputArray *p_Var8;
  const_reference vec;
  _InputArray *p_Var9;
  reference pvVar10;
  double dVar11;
  int n;
  _InputArray local_1a0;
  Mat local_188;
  _InputArray local_128;
  double local_110;
  double err;
  _InputArray local_f0;
  _InputArray local_d8;
  _InputArray local_c0;
  _OutputArray local_a8;
  _InputArray local_90;
  int local_74;
  int local_70;
  int i;
  int k;
  double local_60;
  double total_error;
  undefined1 local_50 [4];
  int total_points;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> image_points2;
  Mat *idx_local;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *tvecs_local;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *rvecs_local;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  *image_points_list_local;
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  *object_points_list_local;
  OmnidirModel *this_local;
  
  image_points2.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)idx;
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_50);
  total_error._4_4_ = 0;
  local_60 = 0.0;
  sVar3 = std::
          vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
          ::size(object_points_list);
  std::vector<double,_std::allocator<double>_>::resize(image_reproj_errors,sVar3);
  local_70 = 0;
  while( true ) {
    iVar1 = local_70;
    iVar2 = cv::Mat::total();
    if (iVar2 <= iVar1) break;
    piVar4 = cv::Mat::at<int>((Mat *)image_points2.
                                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,local_70);
    local_74 = *piVar4;
    pvVar5 = std::
             vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
             ::operator[](object_points_list,(long)local_74);
    cv::_InputArray::_InputArray<cv::Point3_<float>>(&local_90,pvVar5);
    cv::_OutputArray::_OutputArray<cv::Point_<float>>
              (&local_a8,(vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_50)
    ;
    pvVar6 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](rvecs,(long)local_74);
    cv::_InputArray::_InputArray(&local_c0,pvVar6);
    pvVar6 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](tvecs,(long)local_74);
    cv::_InputArray::_InputArray(&local_d8,pvVar6);
    cv::_InputArray::_InputArray(&local_f0,camera_matrix);
    pdVar7 = cv::Mat::at<double>(xi,0);
    dVar11 = *pdVar7;
    cv::_InputArray::_InputArray((_InputArray *)&err,distort_coeffs);
    p_Var8 = (_OutputArray *)cv::noArray();
    cv::omnidir::projectPoints
              (&local_90,&local_a8,&local_c0,&local_d8,&local_f0,dVar11,(_InputArray *)&err,p_Var8);
    cv::_InputArray::~_InputArray((_InputArray *)&err);
    cv::_InputArray::~_InputArray(&local_f0);
    cv::_InputArray::~_InputArray(&local_d8);
    cv::_InputArray::~_InputArray(&local_c0);
    cv::_OutputArray::~_OutputArray(&local_a8);
    cv::_InputArray::~_InputArray(&local_90);
    vec = std::
          vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
          ::operator[](image_points_list,(long)local_74);
    cv::Mat::Mat<cv::Point_<float>>(&local_188,vec,false);
    cv::_InputArray::_InputArray(&local_128,&local_188);
    cv::Mat::Mat<cv::Point_<float>>
              ((Mat *)&stack0xfffffffffffffe00,
               (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_50,false);
    cv::_InputArray::_InputArray(&local_1a0,(Mat *)&stack0xfffffffffffffe00);
    p_Var9 = (_InputArray *)cv::noArray();
    dVar11 = (double)cv::norm(&local_128,&local_1a0,4,p_Var9);
    cv::_InputArray::~_InputArray(&local_1a0);
    cv::Mat::~Mat((Mat *)&stack0xfffffffffffffe00);
    cv::_InputArray::~_InputArray(&local_128);
    cv::Mat::~Mat(&local_188);
    local_110 = dVar11;
    pvVar5 = std::
             vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
             ::operator[](object_points_list,(long)local_74);
    sVar3 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::size(pvVar5);
    dVar11 = sqrt((local_110 * local_110) / (double)(int)sVar3);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        (image_reproj_errors,(long)local_74);
    *pvVar10 = dVar11;
    local_60 = local_110 * local_110 + local_60;
    total_error._4_4_ = (int)sVar3 + total_error._4_4_;
    local_70 = local_70 + 1;
  }
  dVar11 = sqrt(local_60 / (double)total_error._4_4_);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_50);
  return dVar11;
}

Assistant:

double computeReprojectionErrors(
    const std::vector<std::vector<cv::Point3f>>& object_points_list,
    const std::vector<std::vector<cv::Point2f>>& image_points_list,
    const std::vector<cv::Mat>& rvecs,
    const std::vector<cv::Mat>& tvecs,
    const cv::Mat& idx,
    const cv::Mat& camera_matrix,
    const cv::Mat& xi,
    const cv::Mat& distort_coeffs,
    std::vector<double>& image_reproj_errors
  ) {
    std::vector<cv::Point2f> image_points2;
    int total_points = 0;
    double total_error = 0;
    
    image_reproj_errors.resize(object_points_list.size());
    for (int k = 0;  k < (int)idx.total(); ++k) {
      int i = idx.at<int>(k);
      cv::omnidir::projectPoints(
	object_points_list[i],
	image_points2,
	rvecs[i],
	tvecs[i],
	camera_matrix,
	xi.at<double>(0),
	distort_coeffs
      );
      
      double err = cv::norm(
	cv::Mat(image_points_list[i]),
	cv::Mat(image_points2),
	cv::NORM_L2
      );
      int n = (int)object_points_list[i].size();
      image_reproj_errors[i] = (double)std::sqrt(err*err/n);
      total_error += err*err;
      total_points += n;
    }

    return std::sqrt(total_error/total_points);
  }